

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni2name.cpp
# Opt level: O1

void __thiscall
icu_63::UnicodeNameTransliterator::handleTransliterate
          (UnicodeNameTransliterator *this,Replaceable *text,UTransPosition *offsets,UBool param_3)

{
  int32_t iVar1;
  uint code;
  UnicodeString *this_00;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  UErrorCode status;
  UnicodeString str;
  UChar local_e6;
  UErrorCode local_e4;
  char *local_e0;
  int32_t local_d4;
  ConstChar16Ptr local_d0;
  UTransPosition *local_c8;
  char16_t *local_c0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  iVar1 = uprv_getMaxCharNameLength_63();
  if ((iVar1 == 0) || (local_e0 = (char *)uprv_malloc_63((long)iVar1), local_e0 == (char *)0x0)) {
    offsets->start = offsets->limit;
  }
  else {
    uVar4 = offsets->start;
    iVar3 = offsets->limit;
    local_d0.p_ = L"\\N{";
    icu_63::UnicodeString::UnicodeString(&local_b0,'\0',&local_d0,3);
    local_c0 = local_d0.p_;
    local_c8 = offsets;
    if ((int)uVar4 < iVar3) {
      do {
        local_d4 = iVar1;
        code = (*(text->super_UObject)._vptr_UObject[10])(text,(ulong)uVar4);
        local_e4 = U_ZERO_ERROR;
        iVar1 = u_charName_63(code,U_EXTENDED_CHAR_NAME,local_e0,local_d4,&local_e4);
        iVar5 = 2 - (uint)(code < 0x10000);
        if ((0 < iVar1) && (local_e4 < U_ILLEGAL_ARGUMENT_ERROR)) {
          uVar2 = local_b0.fUnion.fFields.fLength;
          if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
            uVar2 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if (3 < (uint)uVar2) {
            local_b0.fUnion.fStackFields.fLengthAndFlags =
                 local_b0.fUnion.fStackFields.fLengthAndFlags & 0x1fU | 0x60;
          }
          icu_63::UnicodeString::UnicodeString(&local_70,local_e0,iVar1,kInvariant);
          uVar2 = local_70.fUnion.fFields.fLength;
          if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
            uVar2 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          this_00 = icu_63::UnicodeString::doAppend(&local_b0,&local_70,0,uVar2);
          local_e6 = L'}';
          icu_63::UnicodeString::doAppend(this_00,&local_e6,0,1);
          icu_63::UnicodeString::~UnicodeString(&local_70);
          (*(text->super_UObject)._vptr_UObject[4])
                    (text,(ulong)uVar4,(ulong)(iVar5 + uVar4),&local_b0);
          iVar5 = iVar1 + 4;
          iVar3 = iVar1 + (code < 0x10000 | 0xfffffffe) + iVar3 + 4;
        }
        uVar4 = uVar4 + iVar5;
        iVar1 = local_d4;
      } while ((int)uVar4 < iVar3);
    }
    local_c8->contextLimit = local_c8->contextLimit + (iVar3 - local_c8->limit);
    local_c8->limit = iVar3;
    local_c8->start = uVar4;
    uprv_free_63(local_e0);
    icu_63::UnicodeString::~UnicodeString(&local_b0);
  }
  return;
}

Assistant:

void UnicodeNameTransliterator::handleTransliterate(Replaceable& text, UTransPosition& offsets,
                                                    UBool /*isIncremental*/) const {
    // The failure mode, here and below, is to behave like Any-Null,
    // if either there is no name data (max len == 0) or there is no
    // memory (malloc() => NULL).

    int32_t maxLen = uprv_getMaxCharNameLength();
    if (maxLen == 0) {
        offsets.start = offsets.limit;
        return;
    }

    // Accomodate the longest possible name plus padding
    char* buf = (char*) uprv_malloc(maxLen);
    if (buf == NULL) {
        offsets.start = offsets.limit;
        return;
    }
    
    int32_t cursor = offsets.start;
    int32_t limit = offsets.limit;

    UnicodeString str(FALSE, OPEN_DELIM, OPEN_DELIM_LEN);
    UErrorCode status;
    int32_t len;

    while (cursor < limit) {
        UChar32 c = text.char32At(cursor);
        int32_t clen = U16_LENGTH(c);
        status = U_ZERO_ERROR;
        if ((len = u_charName(c, U_EXTENDED_CHAR_NAME, buf, maxLen, &status)) >0 && !U_FAILURE(status)) {
            str.truncate(OPEN_DELIM_LEN);
            str.append(UnicodeString(buf, len, US_INV)).append(CLOSE_DELIM);
            text.handleReplaceBetween(cursor, cursor+clen, str);
            len += OPEN_DELIM_LEN + 1; // adjust for delimiters
            cursor += len; // advance cursor and adjust for new text
            limit += len-clen; // change in length
        } else {
            cursor += clen;
        }
    }

    offsets.contextLimit += limit - offsets.limit;
    offsets.limit = limit;
    offsets.start = cursor;

    uprv_free(buf);
}